

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O2

int Fra_ClausSmlNodeIsConst(Fra_Sml_t *pSeq,Aig_Obj_t *pObj)

{
  long lVar1;
  long lVar2;
  
  lVar2 = (long)pSeq->nWordsPref;
  do {
    if (pSeq->nWordsTotal <= lVar2) {
      return 1;
    }
    lVar1 = lVar2 * 4;
    lVar2 = lVar2 + 1;
  } while (*(int *)((long)&pSeq[1].pAig + lVar1 + (long)(pObj->Id * pSeq->nWordsTotal) * 4) == 0);
  return 0;
}

Assistant:

static inline unsigned *   Fra_ObjSim( Fra_Sml_t * p, int Id )                           { return p->pData + p->nWordsTotal * Id; }